

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::V1LayerParameter::Clear(V1LayerParameter *this)

{
  byte bVar1;
  uint uVar2;
  string *psVar3;
  DropoutParameter *pDVar4;
  ThresholdParameter *pTVar5;
  HingeLossParameter *pHVar6;
  TanHParameter *pTVar7;
  SigmoidParameter *pSVar8;
  LogMessage *pLVar9;
  LogFinisher local_721;
  LogMessage local_720;
  LogMessage local_6e8;
  LogMessage local_6b0;
  LogMessage local_678;
  LogMessage local_640;
  LogMessage local_608;
  LogMessage local_5d0;
  LogMessage local_598;
  LogMessage local_560;
  LogMessage local_528;
  LogMessage local_4f0;
  LogMessage local_4b8;
  LogMessage local_480;
  LogMessage local_448;
  LogMessage local_410;
  LogMessage local_3d8;
  LogMessage local_3a0;
  LogMessage local_368;
  LogMessage local_330;
  LogMessage local_2f8;
  LogMessage local_2c0;
  LogMessage local_288;
  LogMessage local_250;
  LogMessage local_218;
  LogMessage local_1e0;
  LogMessage local_1a8;
  LogMessage local_170;
  LogMessage local_138;
  LogMessage local_100;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->bottom_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->top_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
            (&(this->blobs_).super_RepeatedPtrFieldBase);
  (this->blobs_lr_).current_size_ = 0;
  (this->weight_decay_).current_size_ = 0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->include_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->exclude_).super_RepeatedPtrFieldBase);
  (this->loss_weight_).current_size_ = 0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->param_).super_RepeatedPtrFieldBase);
  (this->blob_share_mode_).current_size_ = 0;
  bVar1 = (byte)(this->_has_bits_).has_bits_[0];
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      if ((this->name_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f55);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_58,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_58);
      }
      psVar3 = (this->name_).ptr_;
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
      if (this->layer_ == (V0LayerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f59);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_90,"CHECK failed: layer_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_90);
      }
      V0LayerParameter::Clear(this->layer_);
    }
    if (((this->_has_bits_).has_bits_[0] & 4) != 0) {
      if (this->concat_param_ == (ConcatParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f5d);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_c8,"CHECK failed: concat_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_100,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
      }
      ConcatParameter::Clear(this->concat_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 8) != 0) {
      if (this->convolution_param_ == (ConvolutionParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_100,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f61);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_100,"CHECK failed: convolution_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_100);
      }
      ConvolutionParameter::Clear(this->convolution_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x10) != 0) {
      if (this->data_param_ == (DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_138,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f65);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_138,"CHECK failed: data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_170,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_138);
      }
      DataParameter::Clear(this->data_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x20) != 0) {
      if (this->dropout_param_ == (DropoutParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_170,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f69);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_170,"CHECK failed: dropout_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a8,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_170);
      }
      pDVar4 = this->dropout_param_;
      pDVar4->dropout_ratio_ = 0.5;
      (pDVar4->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pDVar4->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pDVar4->_internal_metadata_)
        ;
      }
    }
    if (((this->_has_bits_).has_bits_[0] & 0x40) != 0) {
      if (this->hdf5_data_param_ == (HDF5DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f6d);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_1a8,"CHECK failed: hdf5_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1a8);
      }
      HDF5DataParameter::Clear(this->hdf5_data_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x80) != 0) {
      if (this->hdf5_output_param_ == (HDF5OutputParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1e0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f71);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_1e0,"CHECK failed: hdf5_output_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_218,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1e0);
      }
      HDF5OutputParameter::Clear(this->hdf5_output_param_);
    }
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 0xff00) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      if (this->image_data_param_ == (ImageDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_218,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f77);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_218,"CHECK failed: image_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_250,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_218);
      }
      ImageDataParameter::Clear(this->image_data_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x200) != 0) {
      if (this->infogain_loss_param_ == (InfogainLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_250,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f7b);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_250,"CHECK failed: infogain_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_288,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_250);
      }
      InfogainLossParameter::Clear(this->infogain_loss_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x400) != 0) {
      if (this->inner_product_param_ == (InnerProductParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_288,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f7f);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_288,"CHECK failed: inner_product_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2c0,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_288);
      }
      InnerProductParameter::Clear(this->inner_product_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x800) != 0) {
      if (this->lrn_param_ == (LRNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_2c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f83);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_2c0,"CHECK failed: lrn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_2c0);
      }
      LRNParameter::Clear(this->lrn_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x1000) != 0) {
      if (this->pooling_param_ == (PoolingParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_2f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f87);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_2f8,"CHECK failed: pooling_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_330,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_2f8);
      }
      PoolingParameter::Clear(this->pooling_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x2000) != 0) {
      if (this->window_data_param_ == (WindowDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_330,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f8b);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_330,"CHECK failed: window_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_368,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_330);
      }
      WindowDataParameter::Clear(this->window_data_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x4000) != 0) {
      if (this->power_param_ == (PowerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_368,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f8f);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_368,"CHECK failed: power_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a0,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_368);
      }
      PowerParameter::Clear(this->power_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x8000) != 0) {
      if (this->memory_data_param_ == (MemoryDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_3a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f93);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_3a0,"CHECK failed: memory_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3d8,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_3a0);
      }
      MemoryDataParameter::Clear(this->memory_data_param_);
    }
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 0xff0000) != 0) {
    if ((uVar2 >> 0x10 & 1) != 0) {
      if (this->argmax_param_ == (ArgMaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_3d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f99);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_3d8,"CHECK failed: argmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_410,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_3d8);
      }
      ArgMaxParameter::Clear(this->argmax_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x20000) != 0) {
      if (this->eltwise_param_ == (EltwiseParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_410,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f9d);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_410,"CHECK failed: eltwise_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_448,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_410);
      }
      EltwiseParameter::Clear(this->eltwise_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x40000) != 0) {
      if (this->threshold_param_ == (ThresholdParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_448,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fa1);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_448,"CHECK failed: threshold_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_480,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_448);
      }
      pTVar5 = this->threshold_param_;
      pTVar5->threshold_ = 0.0;
      (pTVar5->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pTVar5->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pTVar5->_internal_metadata_)
        ;
      }
    }
    if (((this->_has_bits_).has_bits_[0] & 0x80000) != 0) {
      if (this->dummy_data_param_ == (DummyDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_480,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fa5);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_480,"CHECK failed: dummy_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_4b8,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_480);
      }
      DummyDataParameter::Clear(this->dummy_data_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x100000) != 0) {
      if (this->accuracy_param_ == (AccuracyParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_4b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fa9);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_4b8,"CHECK failed: accuracy_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_4f0,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_4b8);
      }
      AccuracyParameter::Clear(this->accuracy_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x200000) != 0) {
      if (this->hinge_loss_param_ == (HingeLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_4f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fad);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_4f0,"CHECK failed: hinge_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_528,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_4f0);
      }
      pHVar6 = this->hinge_loss_param_;
      pHVar6->norm_ = 1;
      (pHVar6->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pHVar6->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pHVar6->_internal_metadata_)
        ;
      }
    }
    if (((this->_has_bits_).has_bits_[0] & 0x400000) != 0) {
      if (this->relu_param_ == (ReLUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_528,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fb1);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_528,"CHECK failed: relu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_560,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_528);
      }
      ReLUParameter::Clear(this->relu_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x800000) != 0) {
      if (this->slice_param_ == (SliceParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_560,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fb5);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_560,"CHECK failed: slice_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_598,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_560);
      }
      SliceParameter::Clear(this->slice_param_);
    }
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if (0xffffff < uVar2) {
    if ((uVar2 >> 0x18 & 1) != 0) {
      if (this->mvn_param_ == (MVNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_598,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fbb);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_598,"CHECK failed: mvn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_5d0,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_598);
      }
      MVNParameter::Clear(this->mvn_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x2000000) != 0) {
      if (this->transform_param_ == (TransformationParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_5d0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fbf);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_5d0,"CHECK failed: transform_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_608,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_5d0);
      }
      TransformationParameter::Clear(this->transform_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x4000000) != 0) {
      if (this->tanh_param_ == (TanHParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_608,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fc3);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_608,"CHECK failed: tanh_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_640,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_608);
      }
      pTVar7 = this->tanh_param_;
      pTVar7->engine_ = 0;
      (pTVar7->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pTVar7->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pTVar7->_internal_metadata_)
        ;
      }
    }
    if (((this->_has_bits_).has_bits_[0] & 0x8000000) != 0) {
      if (this->sigmoid_param_ == (SigmoidParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_640,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fc7);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_640,"CHECK failed: sigmoid_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_678,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_640);
      }
      pSVar8 = this->sigmoid_param_;
      pSVar8->engine_ = 0;
      (pSVar8->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pSVar8->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pSVar8->_internal_metadata_)
        ;
      }
    }
    if (((this->_has_bits_).has_bits_[0] & 0x10000000) != 0) {
      if (this->softmax_param_ == (SoftmaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_678,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fcb);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_678,"CHECK failed: softmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_6b0,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_678);
      }
      SoftmaxParameter::Clear(this->softmax_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x20000000) != 0) {
      if (this->contrastive_loss_param_ == (ContrastiveLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_6b0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fcf);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_6b0,"CHECK failed: contrastive_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_6e8,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_6b0);
      }
      ContrastiveLossParameter::Clear(this->contrastive_loss_param_);
    }
    if (((this->_has_bits_).has_bits_[0] & 0x40000000) != 0) {
      if (this->exp_param_ == (ExpParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_6e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fd3);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_6e8,"CHECK failed: exp_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_720,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_6e8);
      }
      ExpParameter::Clear(this->exp_param_);
    }
    if ((int)(this->_has_bits_).has_bits_[0] < 0) {
      if (this->loss_param_ == (LossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_720,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fd7);
        pLVar9 = google::protobuf::internal::LogMessage::operator<<
                           (&local_720,"CHECK failed: loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_721,pLVar9);
        google::protobuf::internal::LogMessage::~LogMessage(&local_720);
      }
      LossParameter::Clear(this->loss_param_);
    }
  }
  this->type_ = 0;
  *(undefined8 *)(this->_has_bits_).has_bits_ = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void V1LayerParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.V1LayerParameter)
  bottom_.Clear();
  top_.Clear();
  blobs_.Clear();
  blobs_lr_.Clear();
  weight_decay_.Clear();
  include_.Clear();
  exclude_.Clear();
  loss_weight_.Clear();
  param_.Clear();
  blob_share_mode_.Clear();
  if (_has_bits_[0 / 32] & 255u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_layer()) {
      GOOGLE_DCHECK(layer_ != NULL);
      layer_->::caffe::V0LayerParameter::Clear();
    }
    if (has_concat_param()) {
      GOOGLE_DCHECK(concat_param_ != NULL);
      concat_param_->::caffe::ConcatParameter::Clear();
    }
    if (has_convolution_param()) {
      GOOGLE_DCHECK(convolution_param_ != NULL);
      convolution_param_->::caffe::ConvolutionParameter::Clear();
    }
    if (has_data_param()) {
      GOOGLE_DCHECK(data_param_ != NULL);
      data_param_->::caffe::DataParameter::Clear();
    }
    if (has_dropout_param()) {
      GOOGLE_DCHECK(dropout_param_ != NULL);
      dropout_param_->::caffe::DropoutParameter::Clear();
    }
    if (has_hdf5_data_param()) {
      GOOGLE_DCHECK(hdf5_data_param_ != NULL);
      hdf5_data_param_->::caffe::HDF5DataParameter::Clear();
    }
    if (has_hdf5_output_param()) {
      GOOGLE_DCHECK(hdf5_output_param_ != NULL);
      hdf5_output_param_->::caffe::HDF5OutputParameter::Clear();
    }
  }
  if (_has_bits_[8 / 32] & 65280u) {
    if (has_image_data_param()) {
      GOOGLE_DCHECK(image_data_param_ != NULL);
      image_data_param_->::caffe::ImageDataParameter::Clear();
    }
    if (has_infogain_loss_param()) {
      GOOGLE_DCHECK(infogain_loss_param_ != NULL);
      infogain_loss_param_->::caffe::InfogainLossParameter::Clear();
    }
    if (has_inner_product_param()) {
      GOOGLE_DCHECK(inner_product_param_ != NULL);
      inner_product_param_->::caffe::InnerProductParameter::Clear();
    }
    if (has_lrn_param()) {
      GOOGLE_DCHECK(lrn_param_ != NULL);
      lrn_param_->::caffe::LRNParameter::Clear();
    }
    if (has_pooling_param()) {
      GOOGLE_DCHECK(pooling_param_ != NULL);
      pooling_param_->::caffe::PoolingParameter::Clear();
    }
    if (has_window_data_param()) {
      GOOGLE_DCHECK(window_data_param_ != NULL);
      window_data_param_->::caffe::WindowDataParameter::Clear();
    }
    if (has_power_param()) {
      GOOGLE_DCHECK(power_param_ != NULL);
      power_param_->::caffe::PowerParameter::Clear();
    }
    if (has_memory_data_param()) {
      GOOGLE_DCHECK(memory_data_param_ != NULL);
      memory_data_param_->::caffe::MemoryDataParameter::Clear();
    }
  }
  if (_has_bits_[16 / 32] & 16711680u) {
    if (has_argmax_param()) {
      GOOGLE_DCHECK(argmax_param_ != NULL);
      argmax_param_->::caffe::ArgMaxParameter::Clear();
    }
    if (has_eltwise_param()) {
      GOOGLE_DCHECK(eltwise_param_ != NULL);
      eltwise_param_->::caffe::EltwiseParameter::Clear();
    }
    if (has_threshold_param()) {
      GOOGLE_DCHECK(threshold_param_ != NULL);
      threshold_param_->::caffe::ThresholdParameter::Clear();
    }
    if (has_dummy_data_param()) {
      GOOGLE_DCHECK(dummy_data_param_ != NULL);
      dummy_data_param_->::caffe::DummyDataParameter::Clear();
    }
    if (has_accuracy_param()) {
      GOOGLE_DCHECK(accuracy_param_ != NULL);
      accuracy_param_->::caffe::AccuracyParameter::Clear();
    }
    if (has_hinge_loss_param()) {
      GOOGLE_DCHECK(hinge_loss_param_ != NULL);
      hinge_loss_param_->::caffe::HingeLossParameter::Clear();
    }
    if (has_relu_param()) {
      GOOGLE_DCHECK(relu_param_ != NULL);
      relu_param_->::caffe::ReLUParameter::Clear();
    }
    if (has_slice_param()) {
      GOOGLE_DCHECK(slice_param_ != NULL);
      slice_param_->::caffe::SliceParameter::Clear();
    }
  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    if (has_mvn_param()) {
      GOOGLE_DCHECK(mvn_param_ != NULL);
      mvn_param_->::caffe::MVNParameter::Clear();
    }
    if (has_transform_param()) {
      GOOGLE_DCHECK(transform_param_ != NULL);
      transform_param_->::caffe::TransformationParameter::Clear();
    }
    if (has_tanh_param()) {
      GOOGLE_DCHECK(tanh_param_ != NULL);
      tanh_param_->::caffe::TanHParameter::Clear();
    }
    if (has_sigmoid_param()) {
      GOOGLE_DCHECK(sigmoid_param_ != NULL);
      sigmoid_param_->::caffe::SigmoidParameter::Clear();
    }
    if (has_softmax_param()) {
      GOOGLE_DCHECK(softmax_param_ != NULL);
      softmax_param_->::caffe::SoftmaxParameter::Clear();
    }
    if (has_contrastive_loss_param()) {
      GOOGLE_DCHECK(contrastive_loss_param_ != NULL);
      contrastive_loss_param_->::caffe::ContrastiveLossParameter::Clear();
    }
    if (has_exp_param()) {
      GOOGLE_DCHECK(exp_param_ != NULL);
      exp_param_->::caffe::ExpParameter::Clear();
    }
    if (has_loss_param()) {
      GOOGLE_DCHECK(loss_param_ != NULL);
      loss_param_->::caffe::LossParameter::Clear();
    }
  }
  type_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}